

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.cpp
# Opt level: O1

size_t __thiscall GrcErrorList::NumberOfWarningsGiven(GrcErrorList *this)

{
  int iVar1;
  pointer ppGVar2;
  int *piVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  int *piVar9;
  
  ppGVar2 = (this->m_vperr).super__Vector_base<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar5 = 0;
  lVar6 = (long)(this->m_vperr).super__Vector_base<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar2;
  if (lVar6 != 0) {
    piVar3 = (this->m_vnIgnoreWarnings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->m_vnIgnoreWarnings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar7 = 0;
    do {
      if (ppGVar2[(int)uVar7]->m_fFatal == false) {
        bVar8 = piVar3 != piVar4;
        if (piVar3 != piVar4) {
          iVar1 = *piVar3;
          piVar9 = piVar3;
          while (iVar1 != ppGVar2[uVar7]->m_nID) {
            piVar9 = piVar9 + 1;
            bVar8 = piVar9 != piVar4;
            if (piVar9 == piVar4) break;
            iVar1 = *piVar9;
          }
        }
        uVar5 = (ulong)((int)uVar5 + (uint)(bVar8 ^ 1));
      }
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (uVar7 < (ulong)(lVar6 >> 3));
    uVar5 = (ulong)(int)uVar5;
  }
  return uVar5;
}

Assistant:

size_t GrcErrorList::NumberOfWarningsGiven()
{
	int cerrRet = 0;
	for (auto ierr = 0U; ierr < m_vperr.size(); ++ierr)
	{
		if (!IsFatal(ierr) && !IgnoreWarning(m_vperr[ierr]->m_nID))
			cerrRet++;
	}
	return cerrRet;
}